

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ec30ed::AV1FwdTxfm2dTest_match_Test::TestBody(AV1FwdTxfm2dTest_match_Test *this)

{
  lowbd_fwd_txfm_func in_stack_0000a100;
  TX_SIZE in_stack_0000a10f;
  
  testing::
  WithParamInterface<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
  ::GetParam();
  std::get<0ul,unsigned_char,void(*)(short_const*,int*,int,txfm_param*)>
            ((tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)> *)0x9c41a6);
  testing::
  WithParamInterface<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
  ::GetParam();
  std::get<1ul,unsigned_char,void(*)(short_const*,int*,int,txfm_param*)>
            ((tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)> *)0x9c41b9);
  AV1FwdTxfm2dMatchTest(in_stack_0000a10f,in_stack_0000a100);
  return;
}

Assistant:

TEST_P(AV1FwdTxfm2dTest, match) {
  AV1FwdTxfm2dMatchTest(GET_PARAM(0), GET_PARAM(1));
}